

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.cpp
# Opt level: O1

case_insensitive_map_t<LogicalType> * __thiscall
duckdb::PreparedStatement::GetExpectedParameterTypes_abi_cxx11_
          (case_insensitive_map_t<LogicalType> *__return_storage_ptr__,PreparedStatement *this)

{
  PreparedStatementData *pPVar1;
  BoundParameterData *pBVar2;
  BoundParameterData *pBVar3;
  _Hash_node_base *p_Var4;
  allocator_type local_1b;
  key_equal local_1a;
  CaseInsensitiveStringHashFunction local_19;
  
  pPVar1 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&this->data);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,(pPVar1->value_map)._M_h._M_element_count,&local_19,
               &local_1a,&local_1b);
  pPVar1 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&this->data);
  for (p_Var4 = (pPVar1->value_map)._M_h._M_before_begin._M_nxt; p_Var4 != (_Hash_node_base *)0x0;
      p_Var4 = p_Var4->_M_nxt) {
    pBVar2 = shared_ptr<duckdb::BoundParameterData,_true>::operator->
                       ((shared_ptr<duckdb::BoundParameterData,_true> *)(p_Var4 + 5));
    pBVar3 = (BoundParameterData *)
             ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)__return_storage_ptr__,(key_type *)(p_Var4 + 1));
    if (pBVar3 != pBVar2) {
      (pBVar3->value).type_.id_ = (pBVar2->value).type_.id_;
      (pBVar3->value).type_.physical_type_ = (pBVar2->value).type_.physical_type_;
      shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                (&(pBVar3->value).type_.type_info_,&(pBVar2->value).type_.type_info_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

case_insensitive_map_t<LogicalType> PreparedStatement::GetExpectedParameterTypes() const {
	D_ASSERT(data);
	case_insensitive_map_t<LogicalType> expected_types(data->value_map.size());
	for (auto &it : data->value_map) {
		auto &identifier = it.first;
		D_ASSERT(data->value_map.count(identifier));
		D_ASSERT(it.second);
		expected_types[identifier] = it.second->GetValue().type();
	}
	return expected_types;
}